

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_complex_sin(sexp ctx,sexp z)

{
  sexp psVar1;
  sexp in_RDI;
  double f;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  double y;
  double x;
  sexp in_stack_ffffffffffffffa8;
  sexp in_stack_ffffffffffffffb0;
  sexp in_stack_ffffffffffffffb8;
  sexp in_stack_ffffffffffffffc0;
  sexp_gc_var_t local_38;
  sexp local_28;
  double local_20;
  double local_18;
  sexp local_8;
  
  local_8 = in_RDI;
  local_18 = sexp_to_double(in_stack_ffffffffffffffa8,(sexp)0x1307e1);
  local_20 = sexp_to_double(in_stack_ffffffffffffffa8,(sexp)0x1307fa);
  local_28 = (sexp)0x43e;
  memset(&local_38,0,0x10);
  local_38.var = &local_28;
  local_38.next = (local_8->value).context.saves;
  (local_8->value).context.saves = &local_38;
  local_28 = sexp_make_complex(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                               in_stack_ffffffffffffffb0);
  f = sin(local_18);
  cosh(local_20);
  psVar1 = sexp_make_flonum(in_stack_ffffffffffffffb8,f);
  (local_28->value).type.name = psVar1;
  psVar1 = local_8;
  cos(local_18);
  sinh(local_20);
  psVar1 = sexp_make_flonum(psVar1,f);
  (local_28->value).type.cpl = psVar1;
  (local_8->value).context.saves = local_38.next;
  return local_28;
}

Assistant:

sexp sexp_complex_sin (sexp ctx, sexp z) {
  double x = sexp_to_double(ctx, sexp_complex_real(z)),
    y = sexp_to_double(ctx, sexp_complex_imag(z));
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(res) = sexp_make_flonum(ctx, sin(x)*cosh(y));
  sexp_complex_imag(res) = sexp_make_flonum(ctx, cos(x)*sinh(y));
  sexp_gc_release1(ctx);
  return res;
}